

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void anon_unknown.dwarf_574342::CreateGeneratedSource
               (cmLocalGenerator *lg,string *output,OutputRole role,cmCommandOrigin origin,
               cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_b8;
  undefined1 local_98 [32];
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  char *local_60;
  string local_58;
  
  sVar3 = cmGeneratorExpression::Find(output);
  if (sVar3 == 0xffffffffffffffff) {
    bVar2 = cmMakefile::CanIWriteThisFile(lg->Makefile,output);
    if (bVar2) {
      lVar4 = std::__cxx11::string::find_first_of((char *)output,0x6f06fe,0);
      if (lVar4 == -1) {
        if (origin != Generator) {
          return;
        }
        cmMakefile::GetOrCreateGeneratedSource(lg->Makefile,output);
        return;
      }
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_98._0_8_ = (ulong)(role != Primary) * 4 + 6;
      local_98._8_8_ = "BYPRODUCTS";
      if (role == Primary) {
        local_98._8_8_ = "OUTPUT";
      }
      local_98._16_8_ = 0xf;
      local_98._24_8_ = (long)"CONFIGURE called with OUTPUT containing a \"" + 0x1c;
      local_58.field_2._M_local_buf[0] = (output->_M_dataplus)._M_p[lVar4];
      local_70 = &local_58.field_2;
      local_58._M_dataplus._M_p = &DAT_00000001;
      local_78 = 1;
      local_68 = 0x11;
      local_60 = "\" is not allowed.";
      views._M_len = 4;
      views._M_array = (iterator)local_98;
      local_58._M_string_length = (size_type)local_70;
      cmCatViews_abi_cxx11_(&local_b8,views);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_b8,lfbt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return;
      }
    }
    else {
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_98._0_8_ = (ulong)(role != Primary) * 4 + 6;
      local_98._8_8_ = "BYPRODUCTS";
      if (role == Primary) {
        local_98._8_8_ = "OUTPUT";
      }
      local_98._16_8_ = 8;
      local_98._24_8_ = " path\n  ";
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(output->_M_dataplus)._M_p;
      local_78 = output->_M_string_length;
      local_68 = 0x36;
      local_60 = "\nin a source directory as an output of custom command.";
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_98;
      cmCatViews_abi_cxx11_(&local_58,views_00);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_58,lfbt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return;
      }
      local_b8.field_2._M_allocated_capacity =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      local_b8._M_dataplus._M_p = local_58._M_dataplus._M_p;
    }
  }
  else {
    pcVar1 = lg->GlobalGenerator->CMakeInstance;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,
               "Generator expressions in custom command outputs are not implemented!","");
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_98,lfbt);
    local_b8.field_2._M_allocated_capacity = local_98._16_8_;
    local_b8._M_dataplus._M_p = (pointer)local_98._0_8_;
    if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
      return;
    }
  }
  operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void CreateGeneratedSource(cmLocalGenerator& lg, const std::string& output,
                           cmLocalGenerator::OutputRole role,
                           cmCommandOrigin origin,
                           const cmListFileBacktrace& lfbt)
{
  if (cmGeneratorExpression::Find(output) != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Generator expressions in custom command outputs are not implemented!",
      lfbt);
    return;
  }

  // Make sure the file will not be generated into the source
  // directory during an out of source build.
  if (!lg.GetMakefile()->CanIWriteThisFile(output)) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " path\n  ", output,
               "\nin a source directory as an output of custom command."),
      lfbt);
    return;
  }

  // Make sure the output file name has no invalid characters.
  std::string::size_type pos = output.find_first_of("#<>");
  if (pos != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " containing a \"", output[pos],
               "\" is not allowed."),
      lfbt);
    return;
  }

  // Outputs without generator expressions from the project are already
  // created and marked as generated.  Do not mark them again, because
  // other commands might have overwritten the property.
  if (origin == cmCommandOrigin::Generator) {
    lg.GetMakefile()->GetOrCreateGeneratedSource(output);
  }
}